

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# paramdict.cpp
# Opt level: O1

bool ncnn::vstr_is_float(char *vstr)

{
  char cVar1;
  int iVar2;
  long lVar3;
  
  lVar3 = 0;
  do {
    cVar1 = vstr[lVar3];
    if (cVar1 == '\0') {
      return false;
    }
    if (cVar1 == '.') {
      return true;
    }
    iVar2 = tolower((int)cVar1);
    if (iVar2 == 0x65) {
      return true;
    }
    lVar3 = lVar3 + 1;
  } while (lVar3 != 0x10);
  return false;
}

Assistant:

static bool vstr_is_float(const char vstr[16])
{
    // look ahead for determine isfloat
    for (int j=0; j<16; j++)
    {
        if (vstr[j] == '\0')
            break;

        if (vstr[j] == '.' || tolower(vstr[j]) == 'e')
            return true;
    }

    return false;
}